

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::UngroupedAggregateLocalSinkState::InitializeDistinctAggregates
          (UngroupedAggregateLocalSinkState *this,PhysicalUngroupedAggregate *op,
          UngroupedAggregateGlobalSinkState *gstate,ExecutionContext *context)

{
  pointer puVar1;
  size_type __n;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var3;
  type pDVar4;
  type pDVar5;
  type pDVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  type context_00;
  reference pvVar9;
  pointer __k;
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> local_40;
  ExecutionContext *local_38;
  
  if ((op->distinct_data).
      super_unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateData_*,_std::default_delete<duckdb::DistinctAggregateData>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateData_*,_false>._M_head_impl !=
      (DistinctAggregateData *)0x0) {
    local_38 = context;
    pDVar4 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
             ::operator*(&op->distinct_data);
    pDVar5 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
             ::operator*(&gstate->distinct_state);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
    ::resize(&(this->radix_states).
              super_vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>_>_>
             ,(long)(pDVar5->radix_states).
                    super_vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pDVar5->radix_states).
                    super_vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    pDVar6 = unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>,_true>
             ::operator*(&op->distinct_collection_info);
    puVar1 = (pDVar6->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (pDVar6->indices).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pDVar6->table_map,__k);
      __n = *pmVar7;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
               ::get<true>(&pDVar4->radix_tables,__n);
      if ((pvVar8->
          super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
          .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
          (RadixPartitionedHashTable *)0x0) {
        pvVar8 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                 ::get<true>(&pDVar4->radix_tables,__n);
        context_00 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                     ::operator*(pvVar8);
        RadixPartitionedHashTable::GetLocalSinkState
                  ((RadixPartitionedHashTable *)&stack0xffffffffffffffc0,
                   (ExecutionContext *)context_00);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                 ::get<true>(&this->radix_states,__n);
        _Var3._M_head_impl = local_40._M_head_impl;
        local_40._M_head_impl = (LocalSinkState *)0x0;
        _Var2._M_head_impl =
             (pvVar9->
             super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
             ._M_t.
             super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
             .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
        (pvVar9->
        super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)._M_t
        .super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
        .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = _Var3._M_head_impl;
        if (_Var2._M_head_impl != (LocalSinkState *)0x0) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_LocalSinkState + 8))();
        }
        if (local_40._M_head_impl != (LocalSinkState *)0x0) {
          (*(local_40._M_head_impl)->_vptr_LocalSinkState[1])();
        }
      }
    }
  }
  return;
}

Assistant:

void InitializeDistinctAggregates(const PhysicalUngroupedAggregate &op,
	                                  const UngroupedAggregateGlobalSinkState &gstate, ExecutionContext &context) {

		if (!op.distinct_data) {
			return;
		}
		auto &data = *op.distinct_data;
		auto &state = *gstate.distinct_state;
		D_ASSERT(!data.radix_tables.empty());

		const idx_t aggregate_count = state.radix_states.size();
		radix_states.resize(aggregate_count);

		auto &distinct_info = *op.distinct_collection_info;

		for (auto &idx : distinct_info.indices) {
			idx_t table_idx = distinct_info.table_map[idx];
			if (data.radix_tables[table_idx] == nullptr) {
				// This aggregate has identical input as another aggregate, so no table is created for it
				continue;
			}
			auto &radix_table = *data.radix_tables[table_idx];
			radix_states[table_idx] = radix_table.GetLocalSinkState(context);
		}
	}